

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_rank(void **param_1)

{
  roaring64_bitmap_t *r_00;
  uint64_t i_1;
  uint64_t i;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000070;
  uint64_t in_stack_000000a0;
  roaring64_bitmap_t *in_stack_000000a8;
  int in_stack_ffffffffffffffdc;
  char *file;
  ulong b;
  
  r_00 = roaring64_bitmap_create();
  for (b = 0; b < 100; b = b + 1) {
    roaring64_bitmap_add(r_00,b);
  }
  for (file = (char *)0x0; file < (char *)0x64; file = file + 1) {
    roaring64_bitmap_rank(in_stack_000000a8,in_stack_000000a0);
    _assert_int_equal((unsigned_long)r_00,b,file,in_stack_ffffffffffffffdc);
    roaring64_bitmap_rank(in_stack_000000a8,in_stack_000000a0);
    _assert_int_equal((unsigned_long)r_00,b,file,in_stack_ffffffffffffffdc);
  }
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_rank) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 1000);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        assert_int_equal(roaring64_bitmap_rank(r, i * 1000), i + 1);
        assert_int_equal(roaring64_bitmap_rank(r, i * 1000 + 1), i + 1);
    }
    roaring64_bitmap_free(r);
}